

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_handler.hpp
# Opt level: O1

void __thiscall
asio::detail::
binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>
::binder2(binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>
          *this,binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>
                *other)

{
  size_t sVar1;
  error_category *peVar2;
  want wVar3;
  undefined4 uVar4;
  
  (this->handler_).next_layer_ = (other->handler_).next_layer_;
  (this->handler_).core_ = (other->handler_).core_;
  sVar1 = (other->handler_).op_.buffers_.super_mutable_buffer.size_;
  (this->handler_).op_.buffers_.super_mutable_buffer.data_ =
       (other->handler_).op_.buffers_.super_mutable_buffer.data_;
  (this->handler_).op_.buffers_.super_mutable_buffer.size_ = sVar1;
  wVar3 = (other->handler_).want_;
  (this->handler_).start_ = (other->handler_).start_;
  (this->handler_).want_ = wVar3;
  uVar4 = *(undefined4 *)&(other->handler_).ec_.field_0x4;
  peVar2 = (other->handler_).ec_._M_cat;
  (this->handler_).ec_._M_value = (other->handler_).ec_._M_value;
  *(undefined4 *)&(this->handler_).ec_.field_0x4 = uVar4;
  (this->handler_).ec_._M_cat = peVar2;
  (this->handler_).bytes_transferred_ = (other->handler_).bytes_transferred_;
  read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
  ::read_op(&(this->handler_).handler_,&(other->handler_).handler_);
  uVar4 = *(undefined4 *)&(other->arg1_).field_0x4;
  peVar2 = (other->arg1_)._M_cat;
  (this->arg1_)._M_value = (other->arg1_)._M_value;
  *(undefined4 *)&(this->arg1_).field_0x4 = uVar4;
  (this->arg1_)._M_cat = peVar2;
  this->arg2_ = other->arg2_;
  return;
}

Assistant:

binder2(binder2&& other)
    : handler_(ASIO_MOVE_CAST(Handler)(other.handler_)),
      arg1_(ASIO_MOVE_CAST(Arg1)(other.arg1_)),
      arg2_(ASIO_MOVE_CAST(Arg2)(other.arg2_))
  {
  }